

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void snap_restoreval(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref
                    ,TValue *o)

{
  char *pcVar1;
  IRIns *pIVar2;
  IRRef1 *pIVar3;
  uint uVar4;
  TValue TVar5;
  IRIns *ir;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  IRIns *pIVar10;
  lua_Number lVar11;
  
  pIVar2 = T->ir;
  uVar8 = (ulong)ref;
  ir = pIVar2 + uVar8;
  if (0x7fff < ref) {
    do {
      uVar7 = (uint)(ir->field_0).prev;
      if (((rfilt >> (uVar8 & 0x3f) & 1) != 0) &&
         (uVar9 = (ulong)(T->nins - 1), *(char *)((long)pIVar2 + uVar9 * 8 + 5) == '\x14')) {
        pIVar10 = pIVar2 + uVar9;
        do {
          if (((uint)uVar8 == (uint)(pIVar10->field_0).op1) && ((pIVar10->field_0).op2 <= snapno)) {
            uVar7 = (uint)(pIVar10->field_0).prev;
          }
          pcVar1 = (char *)((long)pIVar10 + -3);
          pIVar10 = pIVar10 + -1;
        } while (*pcVar1 == '\x14');
      }
      if (0xff < uVar7) {
        uVar7 = uVar7 >> 8;
        uVar4 = (ir->field_1).t.irt & 0x1f;
        if (uVar4 - 0xf < 5) {
          lVar11 = (lua_Number)ex->spill[uVar7];
          goto LAB_00146d50;
        }
        if (((char)uVar4 != '\x03') && (uVar4 != 0xe)) {
          aVar6 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                   (ex->spill + uVar7);
LAB_00146d8f:
          (o->field_2).field_0 = aVar6;
LAB_00146d93:
          (o->field_2).it = ~uVar4;
          return;
        }
        TVar5 = *(TValue *)(ex->spill + uVar7);
        goto LAB_00146c6e;
      }
      if (uVar7 < 0x80) {
        uVar4 = (ir->field_1).t.irt & 0x1f;
        if (uVar4 - 0xf < 5) {
          lVar11 = (lua_Number)(int)ex->gpr[uVar7];
LAB_00146d50:
          o->n = lVar11;
          return;
        }
        if ((byte)uVar4 == 0xe) {
          lVar11 = ex->fpr[uVar7 - 0x10];
          goto LAB_00146d50;
        }
        if ((0x604208U >> uVar4 & 1) == 0) {
          if ((byte)uVar4 < 3) goto LAB_00146d93;
          aVar6 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                   (ex->gpr + uVar7);
          goto LAB_00146d8f;
        }
        TVar5 = *(TValue *)(ex->gpr + uVar7);
        goto LAB_00146c6e;
      }
      pIVar3 = &(ir->field_0).op1;
      uVar8 = (ulong)*pIVar3;
      ir = pIVar2 + uVar8;
    } while ((short)*pIVar3 < 0);
  }
  if ((ir->field_1).o != '\x19') {
    lj_ir_kvalue(J->L,o,ir);
    return;
  }
  TVar5.field_2.it = 0;
  TVar5.field_2.field_0 =
       (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(ir->field_1).op12;
LAB_00146c6e:
  *o = TVar5;
  return;
}

Assistant:

static void snap_restoreval(jit_State *J, GCtrace *T, ExitState *ex,
			    SnapNo snapno, BloomFilter rfilt,
			    IRRef ref, TValue *o)
{
  IRIns *ir = &T->ir[ref];
  IRType1 t = ir->t;
  RegSP rs = ir->prev;
  if (irref_isk(ref)) {  /* Restore constant slot. */
    if (ir->o == IR_KPTR) {
      o->u64 = (uint64_t)(uintptr_t)ir_kptr(ir);
    } else {
      lj_assertJ(!(ir->o == IR_KKPTR || ir->o == IR_KNULL),
		 "restore of const from IR %04d with bad op %d",
		 ref - REF_BIAS, ir->o);
      lj_ir_kvalue(J->L, o, ir);
    }
    return;
  }
  if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
    rs = snap_renameref(T, snapno, ref, rs);
  if (ra_hasspill(regsp_spill(rs))) {  /* Restore from spill slot. */
    int32_t *sps = &ex->spill[regsp_spill(rs)];
    if (irt_isinteger(t)) {
      setintV(o, *sps);
#if !LJ_SOFTFP32
    } else if (irt_isnum(t)) {
      o->u64 = *(uint64_t *)sps;
#endif
#if LJ_64 && !LJ_GC64
    } else if (irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = *(uint64_t *)sps;
#endif
    } else {
      lj_assertJ(!irt_ispri(t), "PRI ref with spill slot");
      setgcV(J->L, o, (GCobj *)(uintptr_t)*(GCSize *)sps, irt_toitype(t));
    }
  } else {  /* Restore from register. */
    Reg r = regsp_reg(rs);
    if (ra_noreg(r)) {
      lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		 "restore from IR %04d has no reg", ref - REF_BIAS);
      snap_restoreval(J, T, ex, snapno, rfilt, ir->op1, o);
      if (LJ_DUALNUM) setnumV(o, (lua_Number)intV(o));
      return;
    } else if (irt_isinteger(t)) {
      setintV(o, (int32_t)ex->gpr[r-RID_MIN_GPR]);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      setnumV(o, ex->fpr[r-RID_MIN_FPR]);
#elif LJ_64  /* && LJ_SOFTFP */
    } else if (irt_isnum(t)) {
      o->u64 = ex->gpr[r-RID_MIN_GPR];
#endif
#if LJ_64 && !LJ_GC64
    } else if (irt_is64(t)) {
      /* 64 bit values that already have the tag bits. */
      o->u64 = ex->gpr[r-RID_MIN_GPR];
#endif
    } else if (irt_ispri(t)) {
      setpriV(o, irt_toitype(t));
    } else {
      setgcV(J->L, o, (GCobj *)ex->gpr[r-RID_MIN_GPR], irt_toitype(t));
    }
  }
}